

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_connective.c
# Opt level: O3

void sel2_symbol(t_sel2 *x,t_symbol *s)

{
  int iVar1;
  _outlet **pp_Var2;
  
  if ((x->x_type == A_SYMBOL) && (iVar1 = (int)x->x_nelement, iVar1 != 0)) {
    pp_Var2 = &x->x_vec->e_outlet;
    do {
      if ((((t_selectelement *)(pp_Var2 + -1))->e_w).w_symbol == s) {
        outlet_bang(*pp_Var2);
        return;
      }
      pp_Var2 = pp_Var2 + 2;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  outlet_symbol(x->x_rejectout,s);
  return;
}

Assistant:

static void sel2_symbol(t_sel2 *x, t_symbol *s)
{
    t_selectelement *e;
    int nelement;
    if (x->x_type == A_SYMBOL)
    {
        for (nelement = (int)x->x_nelement, e = x->x_vec; nelement--; e++)
            if (e->e_w.w_symbol == s)
        {
            outlet_bang(e->e_outlet);
            return;
        }
    }
    outlet_symbol(x->x_rejectout, s);
}